

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtvf(fitsfile *gfptr,long *firstfailed,int *status)

{
  int iVar1;
  bool bVar2;
  fitsfile *local_90;
  fitsfile *fptr;
  char errstr [71];
  long ngroups;
  long nmembers;
  long i;
  int *status_local;
  long *firstfailed_local;
  fitsfile *gfptr_local;
  
  ngroups = 0;
  stack0xffffffffffffffc0 = 0;
  local_90 = (fitsfile *)0x0;
  if (*status == 0) {
    *firstfailed = 0;
    i = (long)status;
    status_local = (int *)firstfailed;
    firstfailed_local = (long *)gfptr;
    iVar1 = ffgtnm(gfptr,&ngroups,status);
    *(int *)i = iVar1;
    nmembers = 1;
    while( true ) {
      bVar2 = false;
      if (nmembers <= ngroups) {
        bVar2 = *(int *)i == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop((fitsfile *)firstfailed_local,nmembers,&local_90,(int *)i);
      *(int *)i = iVar1;
      ffclos(local_90,(int *)i);
      nmembers = nmembers + 1;
    }
    if (*(int *)i == 0) {
      iVar1 = ffgmng((fitsfile *)firstfailed_local,(long *)(errstr + 0x40),(int *)i);
      *(int *)i = iVar1;
      nmembers = 1;
      while( true ) {
        bVar2 = false;
        if (nmembers <= stack0xffffffffffffffc0) {
          bVar2 = *(int *)i == 0;
        }
        if (!bVar2) break;
        iVar1 = ffgtop((fitsfile *)firstfailed_local,(int)nmembers,&local_90,(int *)i);
        *(int *)i = iVar1;
        ffclos(local_90,(int *)i);
        nmembers = nmembers + 1;
      }
      if (*(int *)i != 0) {
        *(long *)status_local = -nmembers;
        snprintf((char *)&fptr,0x47,"Group table verify failed for GRPID index %ld (ffgtvf)",
                 nmembers);
        ffpmsg((char *)&fptr);
      }
    }
    else {
      *(long *)status_local = nmembers;
      snprintf((char *)&fptr,0x47,"Group table verify failed for member %ld (ffgtvf)",nmembers);
      ffpmsg((char *)&fptr);
    }
    gfptr_local._4_4_ = *(int *)i;
  }
  else {
    gfptr_local._4_4_ = *status;
  }
  return gfptr_local._4_4_;
}

Assistant:

int ffgtvf(fitsfile *gfptr,       /* FITS file pointer to group             */
	   long     *firstfailed, /* Member ID (if positive) of first failed
				     member HDU verify check or GRPID index
				     (if negitive) of first failed group
				     link verify check.                     */
	   int      *status)      /* return status code                     */

/*
 check the integrity of a grouping table to make sure that all group members 
 are accessible and all the links to other grouping tables are valid. The
 firstfailed parameter returns the member ID of the first member HDU to fail
 verification if positive or the first group link to fail if negative; 
 otherwise firstfailed contains a return value of 0.
*/

{
  long i;
  long nmembers = 0;
  long ngroups  = 0;

  char errstr[FLEN_VALUE];

  fitsfile *fptr = NULL;


  if(*status != 0) return(*status);

  *firstfailed = 0;

  do
    {
      /*
	attempt to open all the members of the grouping table. We stop
	at the first member which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status is non-zero from the above loop then record the
	member index that caused the error
      */

      if(*status != 0)
	{
	  *firstfailed = i;
	  snprintf(errstr,FLEN_VALUE,"Group table verify failed for member %ld (ffgtvf)",
		  i);
	  ffpmsg(errstr);
	  continue;
	}

      /*
	attempt to open all the groups linked to this grouping table. We stop
	at the first group which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_groups(gfptr,&ngroups,status);

      for(i = 1; i <= ngroups && *status == 0; ++i)
	{
	  *status = fits_open_group(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status from the above loop is non-zero, then record the
	GRPIDn index of the group that caused the failure
      */

      if(*status != 0)
	{
	  *firstfailed = -1*i;
	  snprintf(errstr,FLEN_VALUE,
		  "Group table verify failed for GRPID index %ld (ffgtvf)",i);
	  ffpmsg(errstr);
	  continue;
	}

    }while(0);

  return(*status);
}